

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O1

void __thiscall DIS::DataStream::DoFlip(DataStream *this,char *buf,size_t bufsize)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  pcVar2 = buf + (bufsize - 1);
  if ((buf < pcVar2 && 1 < bufsize) && this->_machine_endian != this->_stream_endian) {
    pcVar3 = buf + 1;
    do {
      cVar1 = pcVar3[-1];
      pcVar3[-1] = *pcVar2;
      *pcVar2 = cVar1;
      pcVar2 = pcVar2 + -1;
      bVar4 = pcVar3 < pcVar2;
      pcVar3 = pcVar3 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void DataStream::DoFlip(char* buf, size_t bufsize)
{
   if( _machine_endian == _stream_endian || bufsize<2 )
   {
      return;
   }

   // flip it, this fills back to front
   char* start = &buf[0];
   char* end = &buf[bufsize-1];
   while( start < end )
   {
      /// save the beginning of the buffer
      char temp = *start;

      /// overwrite the beginning of the buffer
      *start = *end;
      *end = temp;

      ++start;
      --end;
   }
}